

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,true,false,false>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  int iVar1;
  uint uVar2;
  SVOBitset *in_RDI;
  int got_reverse_label;
  uint c_1;
  int want_reverse_label;
  SVOBitset check_d_values_1;
  PatternAdjacencyBitsType *reverse_edge_graph_pairs_to_consider_1;
  int got_forward_label;
  uint c;
  int want_forward_label;
  SVOBitset check_d_values;
  uint g;
  PatternAdjacencyBitsType *reverse_edge_graph_pairs_to_consider;
  conditional_t<false,_SVOBitset,_tuple<>_> before;
  PatternAdjacencyBitsType *graph_pairs_to_consider;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int iVar3;
  byte local_e9;
  byte *local_e8;
  int local_dc;
  uint local_d8;
  int local_c4;
  uint local_38;
  byte local_31;
  byte *local_30;
  byte local_21;
  byte *local_20;
  
  local_21 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  local_20 = &local_21;
  if ((local_21 & 1) != 0) {
    HomomorphismModel::forward_target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    SVOBitset::operator&=
              (in_RDI,(SVOBitset *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  local_31 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  local_30 = &local_31;
  if ((local_31 & 1) != 0) {
    HomomorphismModel::reverse_target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5c);
    SVOBitset::operator&=
              (in_RDI,(SVOBitset *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  for (local_38 = 1; local_38 < *(uint *)((in_RDI->_data).short_data[0] + 8);
      local_38 = local_38 + 1) {
    if (((uint)*local_20 & 1 << ((byte)local_38 & 0x1f)) != 0) {
      HomomorphismModel::target_graph_row
                ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      SVOBitset::operator&=
                (in_RDI,(SVOBitset *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    }
  }
  if ((*local_20 & 1) != 0) {
    SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_c4 = HomomorphismModel::pattern_edge_label
                         ((HomomorphismModel *)
                          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    local_d8 = SVOBitset::find_first
                         ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                         );
    while (local_d8 != 0xffffffff) {
      SVOBitset::reset((SVOBitset *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe7c);
      local_dc = HomomorphismModel::target_edge_label
                           ((HomomorphismModel *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      if (local_dc != local_c4) {
        SVOBitset::reset((SVOBitset *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         in_stack_fffffffffffffe7c);
      }
      local_d8 = SVOBitset::find_first
                           ((SVOBitset *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    SVOBitset::~SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  }
  local_e9 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  local_e8 = &local_e9;
  if ((local_e9 & 1) != 0) {
    SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    iVar1 = HomomorphismModel::pattern_edge_label
                      ((HomomorphismModel *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    iVar3 = iVar1;
    uVar2 = SVOBitset::find_first
                      ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    while (uVar2 != 0xffffffff) {
      SVOBitset::reset((SVOBitset *)CONCAT44(iVar3,uVar2),in_stack_fffffffffffffe7c);
      in_stack_fffffffffffffe60 =
           HomomorphismModel::target_edge_label
                     ((HomomorphismModel *)CONCAT44(iVar1,in_stack_fffffffffffffe60),
                      in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe7c = in_stack_fffffffffffffe60;
      if (in_stack_fffffffffffffe60 != iVar3) {
        SVOBitset::reset((SVOBitset *)CONCAT44(iVar3,uVar2),in_stack_fffffffffffffe60);
      }
      uVar2 = SVOBitset::find_first
                        ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
      ;
    }
    SVOBitset::~SVOBitset((SVOBitset *)CONCAT44(iVar1,in_stack_fffffffffffffe60));
  }
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}